

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::GridLocalPolynomial::getNormalization
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,GridLocalPolynomial *this
          )

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  pointer pdVar5;
  pointer pdVar6;
  long lVar7;
  int j;
  long lVar8;
  double dVar9;
  allocator_type local_11;
  
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,
             (long)(this->super_BaseCanonicalGrid).num_outputs,&local_11);
  iVar2 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  sVar4 = (this->super_BaseCanonicalGrid).values.num_outputs;
  pdVar6 = (this->super_BaseCanonicalGrid).values.values.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar3 = (this->super_BaseCanonicalGrid).num_outputs;
  for (lVar7 = 0; lVar7 < iVar2; lVar7 = lVar7 + 1) {
    pdVar5 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar8 = 0; lVar8 < iVar3; lVar8 = lVar8 + 1) {
      dVar9 = ABS(pdVar6[lVar8]);
      pdVar1 = pdVar5 + lVar8;
      if (*pdVar1 <= dVar9 && dVar9 != *pdVar1) {
        pdVar5[lVar8] = dVar9;
      }
    }
    pdVar6 = pdVar6 + sVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> GridLocalPolynomial::getNormalization() const{
    std::vector<double> norms(num_outputs);
    for(int i=0; i<points.getNumIndexes(); i++){
        const double *v = values.getValues(i);
        for(int j=0; j<num_outputs; j++){
            if (norms[j] < std::abs(v[j])) norms[j] = std::abs(v[j]);
        }
    }
    return norms;
}